

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t parse_htime_item(archive_read *a,char unix_time,int64_t *sec,uint32_t *nsec,
                        int64_t *extra_data_size)

{
  uint64_t ntfs;
  char cVar1;
  wchar_t wVar2;
  wchar_t extraout_EAX;
  uchar *p;
  undefined7 extraout_var;
  uint32_t time_val;
  uint64_t *local_30;
  
  if (unix_time == '\0') {
    wVar2 = read_ahead(a,8,(uint8_t **)&local_30);
    if (wVar2 != L'\0') {
      ntfs = *local_30;
      wVar2 = consume(a,8);
      if (wVar2 == L'\0') {
        ntfs_to_unix(ntfs,sec,nsec);
        *extra_data_size = *extra_data_size + -8;
        wVar2 = extraout_EAX;
      }
    }
  }
  else {
    cVar1 = read_u32(a,&time_val);
    wVar2 = (wchar_t)CONCAT71(extraout_var,cVar1);
    if (cVar1 != '\0') {
      *extra_data_size = *extra_data_size + -4;
      *sec = (ulong)time_val;
      wVar2 = time_val;
    }
  }
  return wVar2;
}

Assistant:

static int parse_htime_item(struct archive_read* a, char unix_time,
    int64_t* sec, uint32_t* nsec, int64_t* extra_data_size)
{
	if(unix_time) {
		uint32_t time_val;
		if(!read_u32(a, &time_val))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
		*sec = (int64_t) time_val;
	} else {
		uint64_t windows_time;
		if(!read_u64(a, &windows_time))
			return ARCHIVE_EOF;

		ntfs_to_unix(windows_time, sec, nsec);
		*extra_data_size -= 8;
	}

	return ARCHIVE_OK;
}